

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

void __thiscall QtFontStyle::Key::Key(Key *this,QString *styleString)

{
  long lVar1;
  QLatin1StringView s;
  QLatin1StringView s_00;
  bool bVar2;
  byte bVar3;
  int iVar4;
  QString *in_RSI;
  ushort *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined8 in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  char local_38 [24];
  char local_20 [16];
  QString *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(char *)(in_RDI + 1) = (char)in_RDI[1];
  *in_RDI = (ushort)*(undefined3 *)in_RDI & 0xfffc;
  *(char *)(in_RDI + 1) = (char)in_RDI[1];
  *in_RDI = (ushort)*(undefined3 *)in_RDI & 0xf003 | 0x640;
  *in_RDI = *in_RDI & 0xfff;
  *(undefined1 *)(in_RDI + 1) = 0;
  iVar4 = getFontWeight(in_stack_fffffffffffffff0);
  *(char *)(in_RDI + 1) = (char)in_RDI[1];
  *in_RDI = ((ushort)*(undefined3 *)in_RDI & 0xf003) + ((ushort)iVar4 & 0x3ff) * 4;
  bVar2 = QString::isEmpty((QString *)0x73b9d9);
  if (!bVar2) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
               (size_t)in_stack_ffffffffffffff60);
    s.m_data._0_7_ = in_stack_ffffffffffffff78;
    s.m_size = in_stack_ffffffffffffff70;
    s.m_data._7_1_ = in_stack_ffffffffffffff7f;
    bVar2 = QString::contains(in_stack_ffffffffffffff58,s,CaseInsensitive);
    if (bVar2) {
      *(char *)(in_RDI + 1) = (char)in_RDI[1];
      *in_RDI = ((ushort)*(undefined3 *)in_RDI & 0xfffc) + 1;
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                 (size_t)in_stack_ffffffffffffff60);
      s_00.m_data._0_7_ = in_stack_ffffffffffffff78;
      s_00.m_size = in_stack_ffffffffffffff70;
      s_00.m_data._7_1_ = in_stack_ffffffffffffff7f;
      bVar2 = QString::contains(in_stack_ffffffffffffff58,s_00,CaseInsensitive);
      if (bVar2) {
        *(char *)(in_RDI + 1) = (char)in_RDI[1];
        *in_RDI = (ushort)*(undefined3 *)in_RDI & 0xfffc | 2;
      }
      else {
        QCoreApplication::translate(local_20,"QFontDatabase","Italic",0);
        bVar3 = QString::contains(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                  CaseInsensitive);
        QString::~QString((QString *)0x73bb07);
        if ((bVar3 & 1) == 0) {
          QCoreApplication::translate(local_38,"QFontDatabase","Oblique",0);
          bVar3 = QString::contains(in_RSI,in_stack_ffffffffffffff58,CaseInsensitive);
          QString::~QString((QString *)0x73bb7f);
          if ((bVar3 & 1) != 0) {
            *(char *)(in_RDI + 1) = (char)in_RDI[1];
            *in_RDI = (ushort)*(undefined3 *)in_RDI & 0xfffc | 2;
          }
        }
        else {
          *(char *)(in_RDI + 1) = (char)in_RDI[1];
          *in_RDI = ((ushort)*(undefined3 *)in_RDI & 0xfffc) + 1;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QtFontStyle::Key::Key(const QString &styleString)
    : style(QFont::StyleNormal), weight(QFont::Normal), stretch(0)
{
    weight = getFontWeight(styleString);

    if (!styleString.isEmpty()) {
        // First the straightforward no-translation checks, these are fast.
        if (styleString.contains("Italic"_L1))
            style = QFont::StyleItalic;
        else if (styleString.contains("Oblique"_L1))
            style = QFont::StyleOblique;

        // Then the translation checks. These aren't as fast.
        else if (styleString.contains(QCoreApplication::translate("QFontDatabase", "Italic")))
            style = QFont::StyleItalic;
        else if (styleString.contains(QCoreApplication::translate("QFontDatabase", "Oblique")))
            style = QFont::StyleOblique;
    }
}